

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O0

uint32_t imageio::convertSFloatToUInt(uint32_t rawBits,uint32_t numBits)

{
  int in_ESI;
  uint16_t in_DI;
  float fVar1;
  uint local_8;
  uint32_t local_4;
  
  if (in_ESI != 0x10 && in_ESI != 0x20) {
    __assert_fail("numBits == 16 || numBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                  ,0xd2,"uint32_t imageio::convertSFloatToUInt(uint32_t, uint32_t)");
  }
  if (in_ESI == 0x10) {
    fVar1 = half_to_float(in_DI);
    local_4 = (uint32_t)(long)fVar1;
  }
  else if (in_ESI == 0x20) {
    fVar1 = bit_cast<float,unsigned_int>(&local_8);
    local_4 = (uint32_t)(long)fVar1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

[[nodiscard]] inline uint32_t convertSFloatToUInt(uint32_t rawBits, uint32_t numBits) {
    assert(numBits == 16 || numBits == 32);
    if (numBits == 16)
        return static_cast<uint32_t>(half_to_float(static_cast<uint16_t>(rawBits)));
    if (numBits == 32)
        return static_cast<uint32_t>(bit_cast<float>(rawBits));
    return 0;
}